

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O0

void __thiscall
CustomServer::on_client_disconnect
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client)

{
  uint32_t uVar1;
  ostream *poVar2;
  element_type *this_00;
  shared_ptr<blcl::net::connection<MsgType>_> *client_local;
  CustomServer *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[INFO] Client ");
  this_00 = std::
            __shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)client);
  uVar1 = blcl::net::connection<MsgType>::get_id(this_00);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2," has been disconnected.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void on_client_disconnect(std::shared_ptr<blcl::net::connection<MsgType>> client) override {
        std::cout << "[INFO] Client " << client->get_id() << " has been disconnected." << std::endl;
    }